

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O2

void __thiscall QtMWidgets::NavigationArrow::paintEvent(NavigationArrow *this,QPaintEvent *param_1)

{
  Direction DVar1;
  NavigationArrowPrivate *pNVar2;
  QPainter p;
  QRect r;
  
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)&p,true);
  r = QWidget::rect(&this->super_QWidget);
  pNVar2 = (this->d).d;
  DVar1 = pNVar2->direction;
  if (DVar1 == Right) {
    drawArrow(&p,&r,&pNVar2->color);
    pNVar2 = (this->d).d;
    DVar1 = pNVar2->direction;
  }
  if (DVar1 != Bottom) {
    if (DVar1 != Top) {
      if (DVar1 == Left) {
        QPainter::rotate(180.0);
        QPainter::translate(&p,(double)(~r.x2 + r.x1),(double)(~r.y2 + r.y1));
        drawArrow(&p,&r,&((this->d).d)->color);
      }
      goto LAB_0016c73f;
    }
    QPainter::rotate(180.0);
    QPainter::translate(&p,(double)(~r.x2 + r.x1),(double)(~r.y2 + r.y1));
    pNVar2 = (this->d).d;
  }
  drawArrow2(&p,&r,&pNVar2->color);
LAB_0016c73f:
  QPainter::~QPainter(&p);
  return;
}

Assistant:

void
NavigationArrow::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );

	const QRect r = rect();

	if( d->direction == Right )
		drawArrow( &p, r, d->color );
	if( d->direction == Left )
	{
		p.rotate( 180 );
		p.translate( - r.width(), - r.height() );

		drawArrow( &p, r, d->color );
	}
	else if( d->direction == Top )
	{
		p.rotate( 180 );
		p.translate( - r.width(), - r.height() );

		drawArrow2( &p, r, d->color );
	}
	else if( d->direction == Bottom )
		drawArrow2( &p, r, d->color );
}